

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool Args::details::isFlag(String *word)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = isArgument(word);
  if ((!bVar1) && (iVar2 = String::find(word,(Char)0x2d), iVar2 == 0)) {
    return true;
  }
  return false;
}

Assistant:

static inline bool
isFlag( const String & word )
{
	if( !isArgument( word ) )
	{
		if( word.find( SL( '-' ) ) == 0 )
			return true;
	}

	return false;
}